

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall TTD::TTEventList::Iterator::MovePrevious_ReplayOnly(Iterator *this)

{
  BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  TTEventListLink *pTVar1;
  unsigned_long uVar2;
  EventLogEntry *pEVar3;
  size_t sVar4;
  EventLogEntry *local_20;
  
  if (this->m_currLink->StartPos < this->m_currIdx) {
    this_00 = this->m_previousEventMap;
    local_20 = Current(this);
    uVar2 = JsUtil::
            BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(this_00,&local_20);
    this->m_currIdx = uVar2;
  }
  else {
    pTVar1 = this->m_currLink->Previous;
    this->m_currLink = pTVar1;
    this->m_currIdx = 0;
    if ((pTVar1 != (TTEventListLink *)0x0) && (pTVar1->CurrPos != 0)) {
      pEVar3 = Current(this);
      for (sVar4 = this->m_vtable[pEVar3->EventKind].DataSize; sVar4 < this->m_currLink->CurrPos;
          sVar4 = sVar4 + this->m_vtable[pEVar3->EventKind].DataSize) {
        this->m_currIdx = sVar4;
        pEVar3 = Current(this);
      }
    }
  }
  return;
}

Assistant:

void TTEventList::Iterator::MovePrevious_ReplayOnly()
    {
        if(this->m_currIdx > this->m_currLink->StartPos)
        {
            this->m_currIdx = this->m_previousEventMap->Item(this->Current());
        }
        else
        {
            this->m_currLink = this->m_currLink->Previous;
            this->m_currIdx = 0;

            //move index to the last element
            if(this->m_currLink != nullptr && this->m_currIdx < this->m_currLink->CurrPos)
            {
                NSLogEvents::EventLogEntry* data = this->Current();
                size_t npos = this->m_vtable[(uint32)data->EventKind].DataSize;
                while(npos < this->m_currLink->CurrPos)
                {
                    this->m_currIdx = npos;
                    data = this->Current();
                    npos += this->m_vtable[(uint32)data->EventKind].DataSize;
                }
            }
        }
    }